

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

ssize_t __thiscall
anon_unknown.dwarf_1d915f0::Pipe::read(Pipe *this,int __fd,void *__buf,size_t __nbytes)

{
  size_type sVar1;
  reference pvVar2;
  undefined4 in_register_00000034;
  bool bVar3;
  ulong local_48;
  size_t n;
  uint8_t *out;
  unique_lock<std::mutex> lock;
  size_t bytes_local;
  void *buffer_local;
  Pipe *this_local;
  
  lock._8_8_ = __buf;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&out,&this->mutex);
  local_48 = 0;
  do {
    std::condition_variable::
    wait<(anonymous_namespace)::Pipe::read(void*,unsigned_long)::_lambda()_1_>
              (&this->cv,(unique_lock<std::mutex> *)&out,(anon_class_8_1_8991fb9c)this);
    if ((this->closed & 1U) != 0) break;
    while( true ) {
      bVar3 = false;
      if (local_48 < (ulong)lock._8_8_) {
        sVar1 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
        bVar3 = sVar1 != 0;
      }
      if (!bVar3) break;
      pvVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::front(&this->data);
      *(value_type *)(CONCAT44(in_register_00000034,__fd) + local_48) = *pvVar2;
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&this->data);
      local_48 = local_48 + 1;
    }
  } while (local_48 != lock._8_8_);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&out);
  return local_48;
}

Assistant:

size_t read(void* buffer, size_t bytes) override {
    std::unique_lock<std::mutex> lock(mutex);
    auto out = reinterpret_cast<uint8_t*>(buffer);
    size_t n = 0;
    while (true) {
      cv.wait(lock, [&] { return closed || data.size() > 0; });
      if (closed) {
        return n;
      }
      for (; n < bytes && data.size() > 0; n++) {
        out[n] = data.front();
        data.pop_front();
      }
      if (n == bytes) {
        return n;
      }
    }
  }